

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall AI::putChess(AI *this,int i,int j,int who)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference ppVar5;
  int num;
  pair<int,_int> *dir;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  bool flag;
  int who_local;
  int j_local;
  int i_local;
  AI *this_local;
  
  if ((((i < 0) || (this->boardSize <= (ulong)(long)i)) || (j < 0)) ||
     (this->boardSize <= (ulong)(long)j)) {
    this_local._7_1_ = false;
  }
  else {
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](this->board,(long)i);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)j);
    if (*pvVar4 == 0) {
      this_local._7_1_ = false;
      __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (&this->directions);
      dir = (pair<int,_int> *)
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      (&this->directions);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                         *)&dir), bVar1) {
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&__end1);
        iVar2 = reverseDirection(this,i,j,who,*ppVar5,false);
        if (iVar2 != 0) {
          this_local._7_1_ = true;
          reverseDirection(this,i,j,who,*ppVar5,true);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end1);
      }
      if (this_local._7_1_ != false) {
        pvVar3 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](this->board,(long)i);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)j);
        *pvVar4 = who;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AI::putChess(int i, int j, int who) {
    if (i < 0 || i >= boardSize || j < 0 || j >= boardSize) return false;
    if (board[i][j] != EMPTY) return false;
    bool flag = false;
    for (auto &dir: directions) {
        int num = reverseDirection(i, j, who, dir);
        if (num) {
            flag = true;
            reverseDirection(i, j, who, dir, true);
        }
    }
    if (flag) {
        board[i][j] = who;
    }
    return flag;
}